

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewSeed
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this,CKey *key)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  int64_t nCreateTime_;
  mapped_type *pmVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  CKeyMetadata metadata;
  unique_lock<std::recursive_mutex> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  size_type local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [56];
  size_type sStack_70;
  uchar local_68 [8];
  uchar local_60 [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nCreateTime_ = GetTime();
  CKeyMetadata::CKeyMetadata((CKeyMetadata *)local_a8,nCreateTime_);
  CKey::GetPubKey(__return_storage_ptr__,key);
  bVar2 = CKey::VerifyPubKey(key,__return_storage_ptr__);
  if (!bVar2) {
    __assert_fail("key.VerifyPubKey(seed)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4c8,"CPubKey wallet::LegacyScriptPubKeyMan::DeriveNewSeed(const CKey &)");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10),
             0,local_a8._24_8_,"s",1);
  local_40 = false;
  CPubKey::GetID((CKeyID *)local_c8,__return_storage_ptr__);
  sVar1 = local_b8;
  local_68[0] = (uchar)local_b8;
  local_68[1] = local_b8._1_1_;
  local_68[2] = local_b8._2_1_;
  local_68[3] = local_b8._3_1_;
  local_a8._48_8_ = local_c8._0_8_;
  sStack_70 = local_c8._8_8_;
  local_f8._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_f8._M_owns = false;
  local_b8 = sVar1;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  CPubKey::GetID((CKeyID *)local_c8,__return_storage_ptr__);
  pmVar4 = std::
           map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
           ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)local_c8);
  *(undefined8 *)pmVar4 = local_a8._0_8_;
  pmVar4->nCreateTime = local_a8._8_8_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pmVar4->hdKeypath,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10))
  ;
  *(undefined4 *)((pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10) =
       local_68._0_4_;
  *(undefined8 *)(pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems =
       local_a8._48_8_;
  *(size_type *)((pmVar4->hd_seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8) =
       sStack_70;
  *&(pmVar4->key_origin).fingerprint = local_60;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(pmVar4->key_origin).path,&local_58);
  pmVar4->has_key_origin = local_40;
  iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x23])
                    (this,key,__return_storage_ptr__);
  if ((char)iVar3 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DeriveNewSeed","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_e8,": AddKeyPubKey failed");
    local_c8._0_8_ = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ == paVar6) {
      local_b8 = paVar6->_M_allocated_capacity;
      uStack_b0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_c8._0_8_ = &local_b8;
    }
    else {
      local_b8 = paVar6->_M_allocated_capacity;
    }
    local_c8._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)local_c8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
    if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_a8._16_8_ != local_a8 + 0x20) {
      operator_delete((void *)local_a8._16_8_,local_a8._32_8_ + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::DeriveNewSeed(const CKey& key)
{
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // calculate the seed
    CPubKey seed = key.GetPubKey();
    assert(key.VerifyPubKey(seed));

    // set the hd keypath to "s" -> Seed, refers the seed to itself
    metadata.hdKeypath     = "s";
    metadata.has_key_origin = false;
    metadata.hd_seed_id = seed.GetID();

    {
        LOCK(cs_KeyStore);

        // mem store the metadata
        mapKeyMetadata[seed.GetID()] = metadata;

        // write the key&metadata to the database
        if (!AddKeyPubKey(key, seed))
            throw std::runtime_error(std::string(__func__) + ": AddKeyPubKey failed");
    }

    return seed;
}